

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O2

void free_kd_tree(kd_tree_t *tree)

{
  uint uVar1;
  uint uVar2;
  
  if (tree != (kd_tree_t *)0x0) {
    uVar2 = -1 << ((byte)tree->n_level & 0x1f);
    uVar1 = ~uVar2;
    while( true ) {
      uVar2 = uVar2 + 1;
      if (uVar2 == 0) break;
      ckd_free(tree->nodes[uVar1].bbi);
    }
    ckd_free(tree->nodes);
    ckd_free(tree);
    return;
  }
  return;
}

Assistant:

void
free_kd_tree(kd_tree_t * tree)
{
    uint32 i, n;

    if (tree == NULL)
        return;
    /* Balanced binary trees, so we have 2^level-1 nodes. */
    n = (1 << tree->n_level) - 1;
    for (i = 0; i < n; ++i)
        ckd_free(tree->nodes[n].bbi);
    ckd_free(tree->nodes);
    ckd_free(tree);
}